

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O3

void poly3_from_poly(poly3 *out,poly *in)

{
  poly2 *ppVar1;
  int iVar2;
  uint i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  ppVar1 = &out->a;
  lVar3 = 0;
  iVar2 = 0;
  uVar4 = 0;
  uVar5 = 0;
  do {
    uVar7 = ((uint)(int)(short)((in->field_0).v[lVar3] * 8) >> 3) +
            ((uint)(((int)((uint)(in->field_0).v[lVar3] << 0x13) >> 0x13) * 0x5555) >> 0x10) * -3;
    uVar7 = ((int)(short)uVar7 >> 1 & uVar7) - 1 & uVar7;
    uVar6 = (ulong)(uVar7 & 2) << 0x3e;
    uVar5 = uVar5 >> 1 | uVar6;
    uVar4 = uVar4 >> 1 | (ulong)uVar7 << 0x3f | uVar6;
    iVar2 = iVar2 + 1;
    if (iVar2 == 0x40) {
      (out->s).v[0] = uVar5;
      out = (poly3 *)((out->s).v + 1);
      ppVar1->v[0] = uVar4;
      ppVar1 = (poly2 *)(ppVar1->v + 1);
      uVar5 = 0;
      uVar4 = 0;
      iVar2 = 0;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x2bd);
  (out->s).v[0] = uVar5 >> (-(char)iVar2 & 0x3fU);
  ppVar1->v[0] = uVar4 >> (-(char)iVar2 & 0x3fU);
  return;
}

Assistant:

static void poly3_from_poly(struct poly3 *out, const struct poly *in) {
  crypto_word_t *words_s = out->s.v;
  crypto_word_t *words_a = out->a.v;
  crypto_word_t s = 0;
  crypto_word_t a = 0;
  unsigned shift = 0;

  for (unsigned i = 0; i < N; i++) {
    // This duplicates the 13th bit upwards to the top of the uint16,
    // essentially treating it as a sign bit and converting into a signed int16.
    // The signed value is reduced mod 3, yielding {0, 1, 2}.
    const uint16_t v = mod3((int16_t)(in->v[i] << 3) >> 3);
    s >>= 1;
    const crypto_word_t s_bit = (crypto_word_t)(v & 2) << (BITS_PER_WORD - 2);
    s |= s_bit;
    a >>= 1;
    a |= s_bit | (crypto_word_t)(v & 1) << (BITS_PER_WORD - 1);
    shift++;

    if (shift == BITS_PER_WORD) {
      *words_s = s;
      words_s++;
      *words_a = a;
      words_a++;
      s = a = 0;
      shift = 0;
    }
  }

  s >>= BITS_PER_WORD - shift;
  a >>= BITS_PER_WORD - shift;
  *words_s = s;
  *words_a = a;
}